

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluFboRenderContext.cpp
# Opt level: O3

void __thiscall glu::FboRenderContext::destroyFramebuffer(FboRenderContext *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*this->m_context->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_framebuffer != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_framebuffer);
    this->m_framebuffer = 0;
  }
  if (this->m_depthStencilBuffer != 0) {
    (**(code **)(lVar2 + 0x460))(1,&this->m_depthStencilBuffer);
    this->m_depthStencilBuffer = 0;
  }
  if (this->m_colorBuffer != 0) {
    (**(code **)(lVar2 + 0x460))(1,&this->m_colorBuffer);
    this->m_colorBuffer = 0;
  }
  return;
}

Assistant:

void FboRenderContext::destroyFramebuffer (void)
{
	const glw::Functions& gl = m_context->getFunctions();

	if (m_framebuffer)
	{
		gl.deleteFramebuffers(1, &m_framebuffer);
		m_framebuffer = 0;
	}

	if (m_depthStencilBuffer)
	{
		gl.deleteRenderbuffers(1, &m_depthStencilBuffer);
		m_depthStencilBuffer = 0;
	}

	if (m_colorBuffer)
	{
		gl.deleteRenderbuffers(1, &m_colorBuffer);
		m_colorBuffer = 0;
	}
}